

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

char __thiscall helics::Input::getValueChar(Input *this)

{
  bool bVar1;
  defV *prevValue;
  data_view *in_RDI;
  char V;
  int64_t out_1;
  string out;
  data_view dv;
  long *in_stack_00000120;
  DataType in_stack_0000012c;
  string *in_stack_00000130;
  DataType in_stack_0000013c;
  data_view *in_stack_00000140;
  Input *in_stack_000002b0;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  string *in_stack_ffffffffffffff70;
  Input *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  shared_ptr<units::precise_unit> *in_stack_ffffffffffffff88;
  char local_61;
  char *in_stack_ffffffffffffffa8;
  defV *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_stack_ffffffffffffffc0;
  
  checkAndGetFedUpdate(in_stack_ffffffffffffff78);
  bVar1 = data_view::empty((data_view *)0x432e30);
  if (!bVar1) {
    if (*(int *)((long)&in_RDI[2].ref.
                        super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 4) == -1) {
      loadSourceInformation(in_stack_000002b0);
    }
    if ((((*(int *)((long)&in_RDI[2].ref.
                           super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 4) == 0) ||
         (*(int *)((long)&in_RDI[2].ref.
                          super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4) == 0x62ae)) ||
        (*(int *)((long)&in_RDI[2].ref.
                         super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + 4) == 9)) ||
       (*(int *)((long)&in_RDI[2].ref.
                        super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 4) == 0x19)) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      helics::valueExtract(in_stack_00000140,in_stack_0000013c,in_stack_00000130);
      if (((ulong)in_RDI[2].ref.
                  super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi & 1) == 0) {
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        bVar1 = changeDetected((defV *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                               (double)CONCAT17(in_stack_ffffffffffffff6f,
                                                CONCAT16(in_stack_ffffffffffffff6e,
                                                         in_stack_ffffffffffffff68)));
        if (bVar1) {
          std::
          variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
          ::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        }
      }
      std::__cxx11::string::~string(in_stack_ffffffffffffff70);
    }
    else {
      prevValue = (defV *)invalidValue<long>();
      if (*(int *)((long)&in_RDI[2].ref.
                          super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4) == 1) {
        in_stack_ffffffffffffff70 =
             (string *)
             doubleExtractAndConvert
                       (in_RDI,in_stack_ffffffffffffff88,
                        (shared_ptr<units::precise_unit> *)
                        CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      }
      else {
        valueExtract<long>((data_view *)in_stack_00000130,in_stack_0000012c,in_stack_00000120);
      }
      if (((ulong)in_RDI[2].ref.
                  super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi & 1) == 0) {
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                     *)in_RDI,(long *)in_stack_ffffffffffffff88);
      }
      else {
        bVar1 = changeDetected(prevValue,(int64_t)in_stack_ffffffffffffff70,
                               (double)CONCAT17(in_stack_ffffffffffffff6f,
                                                CONCAT16(in_stack_ffffffffffffff6e,
                                                         in_stack_ffffffffffffff68)));
        if (bVar1) {
          std::
          variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
          ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                       *)in_RDI,(long *)in_stack_ffffffffffffff88);
        }
      }
    }
  }
  helics::valueExtract(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *(undefined1 *)
   ((long)&in_RDI[2].ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1) = 0;
  data_view::~data_view((data_view *)0x43305f);
  return local_61;
}

Assistant:

char Input::getValueChar()
{
    auto dv = checkAndGetFedUpdate();
    if (!dv.empty()) {
        if (injectionType == DataType::HELICS_UNKNOWN) {
            loadSourceInformation();
        }

        if ((injectionType == DataType::HELICS_STRING) || (injectionType == DataType::HELICS_ANY) ||
            (injectionType == DataType::HELICS_CHAR) ||
            (injectionType == DataType::HELICS_CUSTOM)) {
            std::string out;
            valueExtract(dv, injectionType, out);
            if (changeDetectionEnabled) {
                if (changeDetected(lastValue, out, delta)) {
                    lastValue = out;
                }
            } else {
                lastValue = out;
            }
        } else {
            int64_t out = invalidValue<int64_t>();
            if (injectionType == helics::DataType::HELICS_DOUBLE) {
                out = static_cast<int64_t>(doubleExtractAndConvert(dv, inputUnits, outputUnits));
            } else {
                valueExtract(dv, injectionType, out);
            }
            if (changeDetectionEnabled) {
                if (changeDetected(lastValue, out, delta)) {
                    lastValue = out;
                }
            } else {
                lastValue = out;
            }
        }
    }
    char V;
    valueExtract(lastValue, V);
    hasUpdate = false;
    return V;
}